

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCtrlSelectNotify(Display *dpy,int screen,int type,int onoff)

{
  XExtDisplayInfo *pXVar1;
  undefined1 *puVar2;
  undefined2 in_CX;
  undefined2 in_DX;
  undefined4 in_ESI;
  long in_RDI;
  xnvCtrlSelectNotifyReq *req;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffffc8;
  int local_4;
  
  pXVar1 = find_display(in_stack_ffffffffffffffc8);
  if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    XMissingExtension(in_RDI,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    if (*(long *)(in_RDI + 0x968) != 0) {
      (*(code *)**(undefined8 **)(in_RDI + 0x968))(in_RDI);
    }
    puVar2 = (undefined1 *)_XGetRequest(in_RDI,6,0xc);
    *puVar2 = (char)pXVar1->codes->major_opcode;
    puVar2[1] = 6;
    *(undefined4 *)(puVar2 + 4) = in_ESI;
    *(undefined2 *)(puVar2 + 8) = in_DX;
    *(undefined2 *)(puVar2 + 10) = in_CX;
    if (*(long *)(in_RDI + 0x968) != 0) {
      (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
    }
    if (*(long *)(in_RDI + 0xd0) != 0) {
      (**(code **)(in_RDI + 0xd0))(in_RDI);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

Bool XNVCtrlSelectNotify (
    Display *dpy,
    int screen,
    int type,
    Bool onoff
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSelectNotifyReq *req;

    if(!XextHasExtension (info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlSelectNotify, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSelectNotify;
    req->screen = screen;
    req->notifyType = type;
    req->onoff = onoff;
    UnlockDisplay (dpy);
    SyncHandle ();

    return True;
}